

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Float32_To_Int16_DitherClip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *src;
  PaInt16 *dest;
  float fVar1;
  float fVar2;
  
  if (count != 0) {
    do {
      fVar1 = PaUtil_GenerateFloatTriangularDither(ditherGenerator);
      fVar2 = *sourceBuffer;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      fVar1 = fVar2 * 32766.0 + fVar1;
      fVar2 = -32768.0;
      if (-32768.0 <= fVar1) {
        fVar2 = fVar1;
      }
      fVar1 = 32767.0;
      if (fVar2 <= 32767.0) {
        fVar1 = fVar2;
      }
      *(short *)destinationBuffer = (short)(int)fVar1;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 2);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_Int16_DitherClip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt16 *dest =  (PaInt16*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {

        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (32766.0f)) + dither;
        PaInt32 samp = (PaInt32) dithered;
        PA_CLIP_( samp, -0x8000, 0x7FFF );
#ifdef PA_USE_C99_LRINTF
        *dest = lrintf(samp-0.5f);
#else
        *dest = (PaInt16) samp;
#endif

        src += sourceStride;
        dest += destinationStride;
    }
}